

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O2

void icu_63::CollationLoader::loadRootRules(UErrorCode *errorCode)

{
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    (anonymous_namespace)::rootBundle = ures_open_63("icudt63l-coll","root",errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      (anonymous_namespace)::rootRules =
           ures_getStringByKey_63
                     ((anonymous_namespace)::rootBundle,"UCARules",
                      &(anonymous_namespace)::rootRulesLength,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        ucln_i18n_registerCleanup_63(UCLN_I18N_UCOL_RES,ucol_res_cleanup);
        return;
      }
      ures_close_63((anonymous_namespace)::rootBundle);
      (anonymous_namespace)::rootBundle = (UResourceBundle *)0x0;
    }
  }
  return;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getFunctionalEquivalent(char* result, int32_t resultCapacity,
                             const char* keyword, const char* locale,
                             UBool* isAvailable, UErrorCode* status)
{
    // N.B.: Resource name is "collations" but keyword is "collation"
    return ures_getFunctionalEquivalent(result, resultCapacity, U_ICUDATA_COLL,
        "collations", keyword, locale,
        isAvailable, TRUE, status);
}